

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeTangent
          (ChVector<double> *__return_storage_ptr__,ChElementBeamANCF_3333 *this,double xi)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ChVector<double> *v;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  ChVector<double> BeamAxisTangent;
  Matrix3xN e_bar;
  Matrix3xN *local_160;
  double *local_158;
  ChVector<double> local_150;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double local_100;
  double dStack_f8;
  Matrix3xN local_f0;
  
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = xi;
  local_138 = xi + -0.5;
  auVar4._0_8_ = this->m_thicknessY;
  auVar4._8_8_ = this->m_thicknessZ;
  auVar1._8_8_ = 0x3fd0000000000000;
  auVar1._0_8_ = 0x3fd0000000000000;
  auVar3 = vmulpd_avx512vl(auVar4,auVar1);
  auVar1 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar6._0_16_,ZEXT816(0x4000000000000000));
  local_118 = auVar3._0_8_ * 0.0;
  dStack_110 = auVar3._8_8_ * 0.0;
  local_130 = auVar1._0_8_ * local_118;
  dStack_128 = auVar1._0_8_ * dStack_110;
  local_120 = xi + 0.5;
  auVar1 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar6._0_16_,ZEXT816(0x3ff0000000000000));
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar4 = vmulpd_avx512vl(auVar4,auVar3);
  local_118 = auVar1._0_8_ * local_118;
  dStack_110 = auVar1._0_8_ * dStack_110;
  local_108 = xi * -2.0;
  local_100 = auVar4._0_8_ * xi;
  dStack_f8 = auVar4._8_8_ * xi;
  CalcCoordMatrix(this,&local_f0);
  local_160 = &local_f0;
  local_158 = &local_138;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            (&local_150,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)&local_160,(type *)0x0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_150.m_data[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_150.m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_150.m_data[1] * local_150.m_data[1];
  auVar4 = vfmadd231sd_fma(auVar9,auVar5,auVar5);
  auVar4 = vfmadd231sd_fma(auVar4,auVar7,auVar7);
  auVar4 = vsqrtsd_avx(auVar4,auVar4);
  bVar2 = 2.2250738585072014e-308 <= auVar4._0_8_;
  dVar8 = 1.0 / auVar4._0_8_;
  __return_storage_ptr__->m_data[0] =
       (double)((ulong)bVar2 * (long)(local_150.m_data[0] * dVar8) +
               (ulong)!bVar2 * 0x3ff0000000000000);
  __return_storage_ptr__->m_data[1] = (double)((ulong)bVar2 * (long)(local_150.m_data[1] * dVar8));
  __return_storage_ptr__->m_data[2] = (double)((ulong)bVar2 * (long)(local_150.m_data[2] * dVar8));
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementBeamANCF_3333::ComputeTangent(const double xi) {
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // partial derivative of the position vector with respect to xi (normalized coordinate along the beam axis).  In
    // general, this will not be a unit vector
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact;

    return BeamAxisTangent.GetNormalized();
}